

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroup::RemoveColumn
          (RowGroup *this,RowGroupCollection *new_collection,idx_t removed_column)

{
  pointer pRVar1;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_00;
  reference __x;
  ulong in_RCX;
  idx_t i;
  ulong __n;
  
  make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,unsigned_long&,std::atomic<unsigned_long>&>
            ((duckdb *)this,(RowGroupCollection *)removed_column,(unsigned_long *)new_collection,
             (atomic<unsigned_long> *)&new_collection->row_group_size);
  pRVar1 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this);
  GetOrCreateVersionInfoPtr((RowGroup *)&stack0xffffffffffffffc8);
  SetVersionInfo(pRVar1,(shared_ptr<duckdb::RowVersionManager,_true> *)&stack0xffffffffffffffc8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  this_00 = GetColumns((RowGroup *)new_collection);
  for (__n = 0; __n < (ulong)((long)(this_00->
                                    super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    if (in_RCX != __n) {
      pRVar1 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                           *)this);
      __x = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,__n);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ::push_back(&(pRVar1->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ,__x);
    }
  }
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)this);
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)this;
}

Assistant:

unique_ptr<RowGroup> RowGroup::RemoveColumn(RowGroupCollection &new_collection, idx_t removed_column) {
	Verify();

	D_ASSERT(removed_column < columns.size());

	auto row_group = make_uniq<RowGroup>(new_collection, this->start, this->count);
	row_group->SetVersionInfo(GetOrCreateVersionInfoPtr());
	// copy over all columns except for the removed one
	auto &cols = GetColumns();
	for (idx_t i = 0; i < cols.size(); i++) {
		if (i != removed_column) {
			row_group->columns.push_back(cols[i]);
		}
	}

	row_group->Verify();
	return row_group;
}